

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::SetShadingPropertiesRaw
          (FBXConverter *this,aiMaterial *out_mat,PropertyTable *props,TextureMap *textures,
          MeshGeometry *mesh)

{
  VideoMap *this_00;
  ulong uVar1;
  Texture *this_01;
  aiMaterial *paVar2;
  FBXConverter *pFVar3;
  bool bVar4;
  __type _Var5;
  uint uVar6;
  TypedProperty<aiVector3t<float>_> *pTVar7;
  TypedProperty<aiColor3D> *pTVar8;
  TypedProperty<aiColor4t<float>_> *pTVar9;
  TypedProperty<float> *pTVar10;
  TypedProperty<int> *pTVar11;
  TypedProperty<bool> *pTVar12;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pTVar13;
  _Base_ptr p_Var14;
  iterator iVar15;
  mapped_type *pmVar16;
  PropertyTable *this_02;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_> _Var17
  ;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar18;
  MeshGeometry *this_03;
  MatIndexArray *pMVar19;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var20;
  uint i;
  size_t __n;
  undefined1 useTemplate;
  uint i_1;
  bool uvFound;
  int uvIndex;
  aiMaterial *out_mat_local;
  FBXConverter *local_6b0;
  undefined8 local_6a8;
  MeshGeometry *local_6a0;
  Video *media;
  uint matIndex;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  _Base_ptr local_620;
  _Base_ptr local_618;
  _Rb_tree_node_base *local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  string prefix;
  aiUVTransform local_5c8;
  PropertyTable local_5b0 [3];
  int value;
  char local_430 [1024];
  
  out_mat_local = out_mat;
  local_6b0 = this;
  local_6a8 = textures;
  local_6a0 = mesh;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,"$raw.",(allocator<char> *)&value);
  PropertyTable::GetUnparsedProperties_abi_cxx11_((DirectPropertyMap *)local_5b0,props);
  for (p_Var14 = local_5b0[0].lazyProps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var14 != (_Rb_tree_node_base *)((long)local_5b0 + 8U);
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
    std::operator+(&name,&prefix,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var14 + 1));
    pTVar7 = Property::As<Assimp::FBX::TypedProperty<aiVector3t<float>>>
                       (*(Property **)(p_Var14 + 2));
    if (pTVar7 == (TypedProperty<aiVector3t<float>_> *)0x0) {
      pTVar8 = Property::As<Assimp::FBX::TypedProperty<aiColor3D>>(*(Property **)(p_Var14 + 2));
      if (pTVar8 == (TypedProperty<aiColor3D> *)0x0) {
        pTVar9 = Property::As<Assimp::FBX::TypedProperty<aiColor4t<float>>>
                           (*(Property **)(p_Var14 + 2));
        if (pTVar9 == (TypedProperty<aiColor4t<float>_> *)0x0) {
          pTVar10 = Property::As<Assimp::FBX::TypedProperty<float>>(*(Property **)(p_Var14 + 2));
          if (pTVar10 == (TypedProperty<float> *)0x0) {
            pTVar11 = Property::As<Assimp::FBX::TypedProperty<int>>(*(Property **)(p_Var14 + 2));
            if (pTVar11 == (TypedProperty<int> *)0x0) {
              pTVar12 = Property::As<Assimp::FBX::TypedProperty<bool>>(*(Property **)(p_Var14 + 2));
              if (pTVar12 == (TypedProperty<bool> *)0x0) {
                pTVar13 = Property::As<Assimp::FBX::TypedProperty<std::__cxx11::string>>
                                    (*(Property **)(p_Var14 + 2));
                if (pTVar13 !=
                    (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x0) {
                  uVar1 = (pTVar13->value)._M_string_length;
                  __n = uVar1 & 0xffffffff;
                  if ((uVar1 & 0xfffffc00) != 0) {
                    __n = 0x3ff;
                  }
                  value = (int)__n;
                  memcpy(local_430,(pTVar13->value)._M_dataplus._M_p,__n);
                  local_430[__n] = '\0';
                  aiMaterial::AddProperty
                            (out_mat_local,(aiString *)&value,name._M_dataplus._M_p,0,0);
                }
              }
              else {
                value = (int)pTVar12->value;
                aiMaterial::AddProperty(out_mat_local,&value,1,name._M_dataplus._M_p,0,0);
              }
            }
            else {
              aiMaterial::AddProperty(out_mat_local,&pTVar11->value,1,name._M_dataplus._M_p,0,0);
            }
          }
          else {
            aiMaterial::AddProperty(out_mat_local,&pTVar10->value,1,name._M_dataplus._M_p,0,0);
          }
        }
        else {
          aiMaterial::AddProperty
                    (out_mat_local,(aiColor4D *)(pTVar9 + 8),1,name._M_dataplus._M_p,0,0);
        }
      }
      else {
        aiMaterial::AddProperty(out_mat_local,(aiColor3D *)(pTVar8 + 8),1,name._M_dataplus._M_p,0,0)
        ;
      }
    }
    else {
      aiMaterial::AddProperty(out_mat_local,&pTVar7->value,1,name._M_dataplus._M_p,0,0);
    }
    std::__cxx11::string::~string((string *)&name);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
               *)local_5b0);
  p_Var14 = *(_Base_ptr *)(local_6a8 + 0x18);
  local_6a8 = local_6a8 + 8;
  this_00 = &local_6b0->textures_converted;
  local_620 = &(local_6b0->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_610 = &(local_6b0->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if (p_Var14 == (_Base_ptr)local_6a8) {
      std::__cxx11::string::~string((string *)&prefix);
      return;
    }
    std::operator+(&name,&prefix,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var14 + 1));
    this_01 = *(Texture **)(p_Var14 + 2);
    if (this_01 != (Texture *)0x0) {
      value = 0;
      local_430[0] = '\0';
      local_618 = p_Var14;
      memset(local_430 + 1,0x1b,0x3ff);
      uVar1 = (this_01->relativeFileName)._M_string_length;
      if (uVar1 < 0x400) {
        value = (int)uVar1;
        memcpy(local_430,(this_01->relativeFileName)._M_dataplus._M_p,uVar1);
        local_430[uVar1] = '\0';
      }
      media = this_01->media;
      if ((media != (Video *)0x0) && (media->contentLength != 0)) {
        iVar15 = std::
                 _Rb_tree<const_Assimp::FBX::Video_*,_std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
                 ::find(&this_00->_M_t,&media);
        if (iVar15._M_node == local_620) {
          uVar6 = ConvertVideo(local_6b0,media);
          pmVar16 = std::
                    map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
                    ::operator[](this_00,&media);
          *pmVar16 = uVar6;
        }
        else {
          uVar6 = *(uint *)&iVar15._M_node[1]._M_parent;
        }
        local_430[0] = '*';
        uVar6 = ASSIMP_itoa10(local_430 + 1,0x3ff,uVar6);
        value = uVar6 + 1;
      }
      paVar2 = out_mat_local;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
                     &name,"|file");
      aiMaterial::AddProperty
                (paVar2,(aiString *)&value,(char *)local_5b0[0].lazyProps._M_t._M_impl._0_8_,0x12,0)
      ;
      std::__cxx11::string::~string((string *)local_5b0);
      paVar2 = out_mat_local;
      local_5c8.mRotation = 0.0;
      local_5c8.mTranslation = this_01->uvTrans;
      local_5c8.mScaling = this_01->uvScaling;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
                     &name,"|uvtrafo");
      useTemplate = 0;
      aiMaterial::AddProperty
                (paVar2,&local_5c8,1,(char *)local_5b0[0].lazyProps._M_t._M_impl._0_8_,0x12,0);
      std::__cxx11::string::~string((string *)local_5b0);
      uvIndex = 0;
      uvFound = false;
      this_02 = Texture::Props(this_01);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_5b0,"UVSet",(allocator<char> *)&local_608);
      PropertyGet<std::__cxx11::string>
                (&local_640,(FBX *)this_02,local_5b0,(string *)&uvFound,(bool *)0x0,
                 (bool)useTemplate);
      pFVar3 = local_6b0;
      std::__cxx11::string::~string((string *)local_5b0);
      if (((uvFound == true) && (bVar4 = std::operator!=(&local_640,"default"), bVar4)) &&
         (local_640._M_string_length != 0)) {
        _Var17 = std::
                 __find_if<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiMaterial*const>>
                           ((pFVar3->materials).
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (pFVar3->materials).
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_finish,&out_mat_local);
        uvIndex = -1;
        matIndex = (uint)((ulong)((long)_Var17._M_current -
                                 (long)(pFVar3->materials).
                                       super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if (local_6a0 == (MeshGeometry *)0x0) {
          for (p_Var14 = (pFVar3->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left; uVar6 = uvIndex, p_Var14 != local_610;
              p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
            if ((*(long *)(p_Var14 + 1) != 0) &&
               (this_03 = (MeshGeometry *)
                          __dynamic_cast(*(long *)(p_Var14 + 1),&Geometry::typeinfo,
                                         &MeshGeometry::typeinfo,0), uVar6 = uvIndex,
               this_03 != (MeshGeometry *)0x0)) {
              pMVar19 = MeshGeometry::GetMaterialIndices(this_03);
              _Var20 = std::
                       __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                 ((pMVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (pMVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish,&matIndex);
              uVar6 = uvIndex;
              if (_Var20._M_current !=
                  (pMVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                uVar6 = 0;
                while ((uVar6 != 8 &&
                       (pvVar18 = MeshGeometry::GetTextureCoords(this_03,uVar6),
                       (pvVar18->
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start !=
                       (pvVar18->
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish))) {
                  MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                            ((string *)local_5b0,this_03,uVar6);
                  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_5b0,&local_640);
                  std::__cxx11::string::~string((string *)local_5b0);
                  if (_Var5) {
                    if (uvIndex == -1) goto LAB_004fcfe8;
                    std::operator+(&local_660,"the UV channel named ",&local_640);
                    std::operator+(&local_608,&local_660,
                                   " appears at different positions in meshes, results will be wrong"
                                  );
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    basic_formatter<std::__cxx11::string>
                              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               local_5b0,&local_608);
                    LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
                    goto LAB_004fcfce;
                  }
                  uVar6 = uVar6 + 1;
                }
                std::operator+(&local_660,"did not find UV channel named ",&local_640);
                std::operator+(&local_608,&local_660," in a mesh using this material");
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                basic_formatter<std::__cxx11::string>
                          ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           local_5b0,&local_608);
                LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
LAB_004fcfce:
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
                std::__cxx11::string::~string((string *)&local_608);
                std::__cxx11::string::~string((string *)&local_660);
                uVar6 = uvIndex;
              }
            }
LAB_004fcfe8:
            uvIndex = uVar6;
          }
        }
        else {
          uVar6 = 0;
          while ((uVar6 != 8 &&
                 (pvVar18 = MeshGeometry::GetTextureCoords(local_6a0,uVar6),
                 (pvVar18->
                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start !=
                 (pvVar18->
                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish))) {
            MeshGeometry::GetTextureCoordChannelName_abi_cxx11_((string *)local_5b0,local_6a0,uVar6)
            ;
            _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_5b0,&local_640);
            std::__cxx11::string::~string((string *)local_5b0);
            if (_Var5) goto LAB_004fd00b;
            uVar6 = uVar6 + 1;
          }
          std::operator+(&local_660,"did not find UV channel named ",&local_640);
          std::operator+(&local_608,&local_660," in a mesh using this material");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_5b0,
                     &local_608);
          LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
          std::__cxx11::string::~string((string *)&local_608);
          std::__cxx11::string::~string((string *)&local_660);
          uVar6 = 0xffffffff;
LAB_004fd00b:
          if (uvIndex != -1) goto LAB_004fd07b;
        }
        uvIndex = uVar6;
        if (uvIndex == -1) {
          std::operator+(&local_660,"failed to resolve UV channel ",&local_640);
          std::operator+(&local_608,&local_660,", using first UV channel");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_5b0,
                     &local_608);
          LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
          std::__cxx11::string::~string((string *)&local_608);
          std::__cxx11::string::~string((string *)&local_660);
          uvIndex = 0;
        }
      }
LAB_004fd07b:
      paVar2 = out_mat_local;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
                     &name,"|uvwsrc");
      aiMaterial::AddProperty
                (paVar2,&uvIndex,1,(char *)local_5b0[0].lazyProps._M_t._M_impl._0_8_,0x12,0);
      std::__cxx11::string::~string((string *)local_5b0);
      std::__cxx11::string::~string((string *)&local_640);
      p_Var14 = local_618;
    }
    std::__cxx11::string::~string((string *)&name);
    p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
  } while( true );
}

Assistant:

void FBXConverter::SetShadingPropertiesRaw(aiMaterial* out_mat, const PropertyTable& props, const TextureMap& textures, const MeshGeometry* const mesh)
{
    // Add all the unparsed properties with a "$raw." prefix

    const std::string prefix = "$raw.";

    for (const DirectPropertyMap::value_type& prop : props.GetUnparsedProperties()) {

        std::string name = prefix + prop.first;

        if (const TypedProperty<aiVector3D>* interpreted = prop.second->As<TypedProperty<aiVector3D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<aiColor3D>* interpreted = prop.second->As<TypedProperty<aiColor3D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<aiColor4D>* interpreted = prop.second->As<TypedProperty<aiColor4D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<float>* interpreted = prop.second->As<TypedProperty<float> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<int>* interpreted = prop.second->As<TypedProperty<int> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<bool>* interpreted = prop.second->As<TypedProperty<bool> >())
        {
            int value = interpreted->Value() ? 1 : 0;
            out_mat->AddProperty(&value, 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<std::string>* interpreted = prop.second->As<TypedProperty<std::string> >())
        {
            const aiString value = aiString(interpreted->Value());
            out_mat->AddProperty(&value, name.c_str(), 0, 0);
        }
    }

    // Add the textures' properties

    for (TextureMap::const_iterator it = textures.begin(); it != textures.end(); it++) {

        std::string name = prefix + it->first;

        const Texture* const tex = (*it).second;
        if (tex != nullptr)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr && media->ContentLength() > 0) {
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                }
                else {
                    index = ConvertVideo(*media);
                    textures_converted[media] = index;
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture)
                path.data[0] = '*';
                path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
            }

            out_mat->AddProperty(&path, (name + "|file").c_str(), aiTextureType_UNKNOWN, 0);

            aiUVTransform uvTrafo;
            // XXX handle all kinds of UV transformations
            uvTrafo.mScaling = tex->UVScaling();
            uvTrafo.mTranslation = tex->UVTranslation();
            out_mat->AddProperty(&uvTrafo, 1, (name + "|uvtrafo").c_str(), aiTextureType_UNKNOWN, 0);
 
            int uvIndex = 0;

            bool uvFound = false;
            const std::string& uvSet = PropertyGet<std::string>(tex->Props(), "UVSet", uvFound);
            if (uvFound) {
                // "default" is the name which usually appears in the FbxFileTexture template
                if (uvSet != "default" && uvSet.length()) {
                    // this is a bit awkward - we need to find a mesh that uses this
                    // material and scan its UV channels for the given UV name because
                    // assimp references UV channels by index, not by name.

                    // XXX: the case that UV channels may appear in different orders
                    // in meshes is unhandled. A possible solution would be to sort
                    // the UV channels alphabetically, but this would have the side
                    // effect that the primary (first) UV channel would sometimes
                    // be moved, causing trouble when users read only the first
                    // UV channel and ignore UV channel assignments altogether.

                    std::vector<aiMaterial*>::iterator materialIt = std::find(materials.begin(), materials.end(), out_mat);
                    const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(), materialIt));

                    uvIndex = -1;
                    if (!mesh)
                    {
                        for (const MeshMap::value_type& v : meshes_converted) {
                            const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*>(v.first);
                            if (!meshGeom) {
                                continue;
                            }

                            const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                            if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                continue;
                            }

                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (meshGeom->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                continue;
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                            else {
                                FBXImporter::LogWarn("the UV channel named " + uvSet + " appears at different positions in meshes, results will be wrong");
                            }
                        }
                    }
                    else
                    {
                        int index = -1;
                        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                            if (mesh->GetTextureCoords(i).empty()) {
                                break;
                            }
                            const std::string& name = mesh->GetTextureCoordChannelName(i);
                            if (name == uvSet) {
                                index = static_cast<int>(i);
                                break;
                            }
                        }
                        if (index == -1) {
                            FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                        }

                        if (uvIndex == -1) {
                            uvIndex = index;
                        }
                    }

                    if (uvIndex == -1) {
                        FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                        uvIndex = 0;
                    }
                }
            }

            out_mat->AddProperty(&uvIndex, 1, (name + "|uvwsrc").c_str(), aiTextureType_UNKNOWN, 0);
        }
            }
        }